

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_characters.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               characters_t<char,_3UL> *fmt)

{
  bool bVar1;
  value_type vVar2;
  size_t sVar3;
  value_type *pvVar4;
  ulong uStack_30;
  char_type ch;
  size_t i;
  characters_t<char,_3UL> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  uStack_30 = 0;
  while( true ) {
    sVar3 = static_string<char,_3UL>::length(&fmt->value);
    if (sVar3 <= uStack_30) {
      bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>>
                        (pos,end);
      return bVar1;
    }
    bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator==
                      (pos,end);
    if (bVar1) break;
    vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator*(pos)
    ;
    pvVar4 = static_string<char,_3UL>::operator[](&fmt->value,uStack_30);
    if (vVar2 != *pvVar4) {
      return false;
    }
    uStack_30 = uStack_30 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  return false;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, const characters_t<Char, Length>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    for (std::size_t i = 0; i < fmt.value.length(); ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        if (ch != fmt.value[i])
            return false;
    }

    return read_impl(pos, end, std::forward<Others>(others)...);
}